

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall duckdb::SingleFileBlockManager::Truncate(SingleFileBlockManager *this)

{
  _Rb_tree_header *__last;
  block_id_t *__k;
  _Base_ptr p_Var1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  iterator iVar4;
  pointer this_00;
  unsigned_long uVar5;
  idx_t iVar6;
  block_id_t bVar7;
  reverse_iterator<std::_Rb_tree_const_iterator<long>_> __tmp;
  long lVar8;
  
  BlockManager::Truncate(&this->super_BlockManager);
  __last = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = this->max_block;
  __k = &this->max_block;
  lVar8 = 0;
  p_Var3 = &__last->_M_header;
  while (p_Var3 != p_Var1) {
    lVar2 = ::std::_Rb_tree_decrement(p_Var3);
    if (bVar7 != *(long *)(lVar2 + 0x20) + 1) break;
    bVar7 = bVar7 + -1;
    *__k = bVar7;
    p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var3);
    lVar8 = lVar8 + -1;
  }
  if (lVar8 != 0) {
    iVar4 = ::std::
            _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
            lower_bound(&(this->free_list)._M_t,__k);
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    _M_erase_aux(&(this->free_list)._M_t,(const_iterator)iVar4._M_node,(const_iterator)__last);
    iVar4 = ::std::
            _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
            lower_bound(&(this->newly_freed_list)._M_t,__k);
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    _M_erase_aux(&(this->newly_freed_list)._M_t,(const_iterator)iVar4._M_node,
                 (const_iterator)&(this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header);
    this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->(&this->handle);
    uVar5 = NumericCastImpl<unsigned_long,_long,_false>::Convert(this->max_block);
    iVar6 = optional_idx::GetIndex(&(this->super_BlockManager).block_alloc_size);
    lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar5 * iVar6 + 0x3000);
    FileHandle::Truncate(this_00,lVar8);
    return;
  }
  return;
}

Assistant:

void SingleFileBlockManager::Truncate() {
	BlockManager::Truncate();
	idx_t blocks_to_truncate = 0;
	// reverse iterate over the free-list
	for (auto entry = free_list.rbegin(); entry != free_list.rend(); entry++) {
		auto block_id = *entry;
		if (block_id + 1 != max_block) {
			break;
		}
		blocks_to_truncate++;
		max_block--;
	}
	if (blocks_to_truncate == 0) {
		// nothing to truncate
		return;
	}
	// truncate the file
	free_list.erase(free_list.lower_bound(max_block), free_list.end());
	newly_freed_list.erase(newly_freed_list.lower_bound(max_block), newly_freed_list.end());
	handle->Truncate(NumericCast<int64_t>(BLOCK_START + NumericCast<idx_t>(max_block) * GetBlockAllocSize()));
}